

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Secp256k1::CompressPubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *uncompressed_pubkey)

{
  secp256k1_context *ctx;
  int iVar1;
  size_t sVar2;
  CfdException *pCVar3;
  allocator local_a9;
  undefined1 local_a8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  size_t byte_size;
  secp256k1_pubkey pubkey;
  
  ctx = (secp256k1_context *)this->secp256k1_context_;
  if (ctx == (secp256k1_context *)0x0) {
    pubkey.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 0x66;
    pubkey.data[8] = 'w';
    pubkey.data[9] = '\0';
    pubkey.data[10] = '\0';
    pubkey.data[0xb] = '\0';
    pubkey.data._16_8_ = anon_var_dwarf_5e78ee;
    logger::warn<>((CfdSourceLocation *)&pubkey,"Secp256k1 context is NULL.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&pubkey,"Secp256k1 context is NULL.",(allocator *)local_a8);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&pubkey);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(uncompressed_pubkey);
  if (sVar2 != 0x41) {
    pubkey.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 0x66;
    pubkey.data[8] = '}';
    pubkey.data[9] = '\0';
    pubkey.data[10] = '\0';
    pubkey.data[0xb] = '\0';
    pubkey.data._16_8_ = anon_var_dwarf_5e78ee;
    logger::warn<>((CfdSourceLocation *)&pubkey,"Invalid Argument pubkey size.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&pubkey,"Invalid Pubkey size.",(allocator *)local_a8);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&pubkey);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,
                     uncompressed_pubkey);
  sVar2 = ByteData::GetDataSize(uncompressed_pubkey);
  iVar1 = secp256k1_ec_pubkey_parse(ctx,&pubkey,(uchar *)local_a8._0_8_,sVar2);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  if (iVar1 != 1) {
    local_a8._0_8_ = "cfdcore_secp256k1.cpp";
    local_a8._8_4_ = 0x87;
    local_a8._16_8_ = "CompressPubkeySecp256k1Ec";
    logger::warn<>((CfdSourceLocation *)local_a8,"Secp256k1 pubkey parse Error.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_a8,"Secp256k1 pubkey parse Error.",(allocator *)&byte_data);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_a8);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&byte_data,0x21,(allocator_type *)local_a8);
  byte_size = (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  iVar1 = secp256k1_ec_pubkey_serialize
                    (ctx,byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,&byte_size,&pubkey,0x102);
  if (iVar1 == 1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&byte_data,byte_size);
    ByteData::ByteData(__return_storage_ptr__,&byte_data);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_a8._0_8_ = "cfdcore_secp256k1.cpp";
  local_a8._8_4_ = 0x92;
  local_a8._16_8_ = "CompressPubkeySecp256k1Ec";
  logger::warn<>((CfdSourceLocation *)local_a8,"Secp256k1 pubkey serialize Error.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_a8,"Secp256k1 pubkey serialize Error.",&local_a9);
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_a8);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Secp256k1::CompressPubkeySecp256k1Ec(
    const ByteData& uncompressed_pubkey) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }

  if (uncompressed_pubkey.GetDataSize() != 65) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }

  secp256k1_pubkey pubkey;
  int ret = secp256k1_ec_pubkey_parse(
      context, &pubkey, uncompressed_pubkey.GetBytes().data(),
      uncompressed_pubkey.GetDataSize());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey parse Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
  }

  std::vector<uint8_t> byte_data(33);
  size_t byte_size = byte_data.size();
  // Format ByteData
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &pubkey, SECP256K1_EC_COMPRESSED);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey serialize Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  byte_data.resize(byte_size);
  return ByteData(byte_data);
}